

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O3

TIntermTyped *
glslang::TIntermediate::traverseLValueBase
          (TIntermTyped *node,bool swizzleOkay,bool bufferReferenceOk,
          function<bool_(const_TIntermNode_&)> *proc)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  long *plVar5;
  undefined4 extraout_var_00;
  long *plVar4;
  
  iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x14])();
  plVar4 = (long *)CONCAT44(extraout_var,iVar3);
  do {
    if (plVar4 == (long *)0x0) {
      if ((proc->super__Function_base)._M_manager != (_Manager_type)0x0) {
        (*proc->_M_invoker)((_Any_data *)proc,&node->super_TIntermNode);
      }
      return node;
    }
    iVar3 = (int)plVar4[0x17];
    if ((3 < iVar3 - 0x33U) && (iVar3 != 0x2d7)) {
      return (TIntermTyped *)0x0;
    }
    if (!swizzleOkay) {
      if (iVar3 == 0x36) {
        return (TIntermTyped *)0x0;
      }
      if (iVar3 == 0x2d7) {
        return (TIntermTyped *)0x0;
      }
      if (iVar3 - 0x33U < 2) {
        plVar5 = (long *)(**(code **)(*plVar4 + 400))(plVar4);
        plVar5 = (long *)(**(code **)(*plVar5 + 0xf0))(plVar5);
        cVar1 = (**(code **)(*plVar5 + 0xd8))(plVar5);
        if (cVar1 == '\0') {
          plVar5 = (long *)(**(code **)(*plVar4 + 400))(plVar4);
          plVar5 = (long *)(**(code **)(*plVar5 + 0xf0))(plVar5);
          cVar1 = (**(code **)(*plVar5 + 0xc0))(plVar5);
          if (cVar1 == '\0') goto LAB_00498e6b;
        }
        plVar5 = (long *)(**(code **)(*plVar4 + 400))(plVar4);
        plVar5 = (long *)(**(code **)(*plVar5 + 0xf0))(plVar5);
        cVar1 = (**(code **)(*plVar5 + 0xe8))(plVar5);
        if (cVar1 == '\0') {
          return (TIntermTyped *)0x0;
        }
      }
    }
LAB_00498e6b:
    if (((proc->super__Function_base)._M_manager != (_Manager_type)0x0) &&
       (bVar2 = (*proc->_M_invoker)((_Any_data *)proc,&node->super_TIntermNode), !bVar2)) {
      return node;
    }
    node = (TIntermTyped *)(**(code **)(*plVar4 + 400))(plVar4);
    if ((bufferReferenceOk) && (iVar3 = (*(node->type)._vptr_TType[7])(&node->type), iVar3 == 0x12))
    {
      return node;
    }
    iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x14])(node);
    plVar4 = (long *)CONCAT44(extraout_var_00,iVar3);
  } while( true );
}

Assistant:

const TIntermTyped* TIntermediate::traverseLValueBase(const TIntermTyped* node, bool swizzleOkay,
                                                      bool bufferReferenceOk,
                                                      std::function<bool(const TIntermNode&)> proc)
{
    do {
        const TIntermBinary* binary = node->getAsBinaryNode();
        if (binary == nullptr) {
            if (proc) {
                proc(*node);
            }
            return node;
        }
        TOperator op = binary->getOp();
        if (op != EOpIndexDirect && op != EOpIndexIndirect && op != EOpIndexDirectStruct && op != EOpVectorSwizzle &&
            op != EOpMatrixSwizzle)
            return nullptr;
        if (!swizzleOkay) {
            if (op == EOpVectorSwizzle || op == EOpMatrixSwizzle)
                return nullptr;
            if ((op == EOpIndexDirect || op == EOpIndexIndirect) &&
                (binary->getLeft()->getType().isVector() || binary->getLeft()->getType().isScalar()) &&
                !binary->getLeft()->getType().isArray())
                return nullptr;
        }
        if (proc) {
            if (!proc(*node)) {
                return node;
            }
        }
        node = binary->getLeft();
        if (bufferReferenceOk && node->isReference())
            return node;
    } while (true);
}